

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
               *this,Context *context)

{
  Context **this_00;
  Context **this_01;
  float fVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  Context *__first;
  float fVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  TestInstance *pTVar8;
  TestTexture2DArray *this_02;
  long lVar9;
  ulong uVar10;
  FilterCase *__result;
  FilterCase *pFVar11;
  Context *pCVar12;
  allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>
  *__alloc;
  FilterCase *__args;
  FilterCase *extraout_RDX;
  size_t __n;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  Vector<float,_4> VVar22;
  RGBA local_1d0;
  RGBA local_1cc;
  undefined8 local_1c8;
  Vector<float,_4> local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  Vector<float,_4> local_198;
  TestInstance *local_180;
  Vec4 gMax;
  Vector<float,_3> local_168;
  float local_15c;
  Vec4 cBias;
  Vec4 cScale;
  Vec4 gMin;
  Vector<float,_4> local_90;
  tcu local_80 [16];
  TextureFormatInfo fmtInfo;
  
  pTVar8 = (TestInstance *)operator_new(0x288);
  pTVar8->m_context = context;
  pTVar8->_vptr_TestInstance = (_func_int **)&PTR__Texture2DArrayShadowTestInstance_00bdf210;
  pTVar8[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar8[1].m_context;
  local_180 = pTVar8 + 3;
  this_01 = &pTVar8[4].m_context;
  pTVar8[1].m_context = (Context *)0x0;
  pTVar8[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar8[2].m_context = (Context *)0x0;
  pTVar8[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar8[3].m_context = (Context *)0x0;
  pTVar8[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)this_01,context,
             (this->m_testsParameters).super_Texture2DArrayTestCaseParameters.
             super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.sampleCount,
             0x40,0x40);
  *(undefined4 *)&pTVar8[0x28]._vptr_TestInstance = 0;
  pp_Var4 = pTVar8[1]._vptr_TestInstance;
  uVar18 = *(uint *)((long)pp_Var4 + 0x44);
  if ((int)*(uint *)((long)pp_Var4 + 0x44) < (int)*(uint *)(pp_Var4 + 8)) {
    uVar18 = *(uint *)(pp_Var4 + 8);
  }
  local_1a8._0_4_ = 4.48416e-44;
  uVar13 = (uint)(float)local_1a8;
  if (uVar18 != 0) {
    uVar13 = 0x1f;
    if (uVar18 != 0) {
      for (; uVar18 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar13 = uVar13 ^ 0x1f;
  }
  gMin.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pp_Var4 + 4));
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&gMin);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
             *)this_00,2);
  local_1a8 = CONCAT44(local_1a8._4_4_,(int)(float)local_1a8 - uVar13);
  iVar14 = 2;
  while (bVar19 = iVar14 != 0, iVar14 = iVar14 + -1, bVar19) {
    this_02 = (TestTexture2DArray *)operator_new(0x78);
    gMax.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar8[1]._vptr_TestInstance + 4));
    pp_Var4 = pTVar8[1]._vptr_TestInstance;
    vkt::pipeline::TestTexture2DArray::TestTexture2DArray
              (this_02,(TextureFormat *)&gMax,*(int *)(pp_Var4 + 8),*(int *)((long)pp_Var4 + 0x44),
               *(int *)(pp_Var4 + 9));
    de::SharedPtr<vkt::pipeline::TestTexture2DArray>::SharedPtr
              ((SharedPtr<vkt::pipeline::TestTexture2DArray> *)&gMin,this_02);
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2DArray> *)&gMin);
    de::SharedPtr<vkt::pipeline::TestTexture2DArray>::release
              ((SharedPtr<vkt::pipeline::TestTexture2DArray> *)&gMin);
  }
  local_1c8 = (local_1a8 & 0xffffffff) * 0x28;
  for (lVar15 = 0; local_1c8 != lVar15; lVar15 = lVar15 + 0x28) {
    local_1b8.m_data[0] = -0.5;
    local_1b8.m_data[1] = -0.5;
    local_1b8.m_data[2] = -0.5;
    local_1b8.m_data[3] = 2.0;
    tcu::operator*((tcu *)&gMax,&local_1b8,&cScale);
    tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
    local_198.m_data._0_8_ = &DAT_3f8000003f800000;
    local_198.m_data[2] = 1.0;
    local_198.m_data[3] = 0.0;
    tcu::operator*((tcu *)&local_1b8,&local_198,&cScale);
    VVar22 = tcu::operator+((tcu *)&gMax,&local_1b8,&cBias);
    lVar9 = (*(code *)(*this_00)->m_testCtx->m_platform[0x11]._vptr_Platform)
                      (VVar22.m_data[0],VVar22.m_data[2]);
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)(*(long *)(lVar9 + 0x20) + lVar15),&gMin,&gMax);
  }
  iVar14 = 0;
  for (lVar15 = 0; local_1c8 != lVar15; lVar15 = lVar15 + 0x28) {
    uVar10 = local_1a8 & 0xffffffff;
    lVar9 = (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x88))
                      ();
    uVar18 = (int)(0xffffff / uVar10) * iVar14;
    local_1cc.m_value = uVar18 | 0xff000000;
    lVar9 = *(long *)(lVar9 + 0x20);
    tcu::RGBA::toVec(&local_1cc);
    tcu::operator*((tcu *)&gMax,&local_1b8,&cScale);
    tcu::operator+((tcu *)&gMin,&gMax,&cBias);
    local_1d0.m_value = ~uVar18 | 0xff000000;
    tcu::RGBA::toVec(&local_1d0);
    tcu::operator*(local_80,&local_90,&cScale);
    tcu::operator+((tcu *)&local_198,(Vector<float,_4> *)local_80,&cBias);
    tcu::fillWithGrid((PixelBufferAccess *)(lVar9 + lVar15),4,&gMin,(Vec4 *)&local_198);
    iVar14 = iVar14 + 1;
  }
  for (pCVar12 = pTVar8[1].m_context; pCVar12 != (Context *)pTVar8[2]._vptr_TestInstance;
      pCVar12 = (Context *)&pCVar12->m_progCollection) {
    TextureRenderer::add2DArrayTexture((TextureRenderer *)this_01,(TestTexture2DArraySp *)pCVar12);
  }
  gMin.m_data._0_8_ =
       (ulong)*(uint *)(&DAT_009cbf60 + (ulong)(*(int *)pTVar8[1]._vptr_TestInstance - 5U < 2) * 4)
       << 0x20;
  gMin.m_data[2] = 1.6;
  gMin.m_data[3] = 2.9;
  iVar14 = *(int *)(pTVar8[1]._vptr_TestInstance + 9);
  lVar15 = 0x10;
  do {
    if (lVar15 == 0xa0) {
      return pTVar8;
    }
    iVar2 = *(int *)((long)cScale.m_data + lVar15);
    fVar1 = *(float *)((long)cScale.m_data + lVar15 + 4);
    local_1c8 = CONCAT44(local_1c8._4_4_,*(undefined4 *)((long)cScale.m_data + lVar15 + 0xc));
    local_1a8 = *(ulong *)((long)gMin.m_data + lVar15);
    uStack_1a0 = 0;
    fVar20 = deFloatExp2(*(float *)((long)cScale.m_data + lVar15 + 8));
    dVar6 = TextureRenderer::getRenderWidth((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar2) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    iVar3 = *(int *)(lVar9 + 0x38);
    fVar21 = deFloatExp2((float)local_1c8);
    local_1c8 = CONCAT44(extraout_XMM0_Db,fVar21);
    dVar7 = TextureRenderer::getRenderHeight((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(ulong)(0 < iVar2) * 2]->m_platform[0x11].
                      _vptr_Platform)();
    fVar21 = (float)local_1a8;
    fVar5 = local_1a8._4_4_;
    local_1b8.m_data[0] = (float)local_1a8;
    local_1b8.m_data[1] = local_1a8._4_4_;
    local_1b8.m_data[2] = -0.5;
    local_198.m_data._0_8_ =
         CONCAT44(((float)local_1c8 * (float)dVar7) / (float)*(int *)(lVar9 + 0x3c) + fVar5,
                  (fVar20 * (float)dVar6) / (float)iVar3 + fVar21);
    local_198.m_data[2] = (float)iVar14;
    gMax.m_data[0] = (float)(uint)(0 < iVar2);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(gMax.m_data + 1),(Vector<float,_3> *)&local_1b8);
    tcu::Vector<float,_3>::Vector(&local_168,(Vector<float,_3> *)&local_198);
    pCVar12 = pTVar8[3].m_context;
    local_15c = fVar1;
    if (pCVar12 == (Context *)pTVar8[4]._vptr_TestInstance) {
      __first = (Context *)local_180->_vptr_TestInstance;
      if ((long)pCVar12 - (long)__first == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar17 = (long)pCVar12 - (long)__first >> 5;
      uVar10 = uVar17;
      if (pCVar12 == __first) {
        uVar10 = 1;
      }
      uVar16 = uVar10 + uVar17;
      __alloc = (allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>
                 *)0x3ffffffffffffff;
      if (0x3fffffffffffffe < uVar16) {
        uVar16 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar10,uVar17)) {
        uVar16 = 0x3ffffffffffffff;
      }
      if (uVar16 == 0) {
        __result = (FilterCase *)0x0;
        pFVar11 = __args;
      }
      else {
        __result = (FilterCase *)operator_new(uVar16 << 5);
        pFVar11 = extraout_RDX;
      }
      std::
      allocator_traits<std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>>
      ::
      construct<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase,vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>
                ((allocator_type *)(__result + uVar17),(FilterCase *)&gMax,pFVar11);
      pFVar11 = std::
                __uninitialized_move_if_noexcept_a<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase*,vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase*,std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>>
                          ((FilterCase *)__first,(FilterCase *)pCVar12,__result,__alloc);
      pCVar12 = (Context *)
                std::
                __uninitialized_move_if_noexcept_a<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase*,vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase*,std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>>
                          ((FilterCase *)pCVar12,(FilterCase *)pCVar12,pFVar11 + 1,__alloc);
      std::
      _Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>_>
      ::_M_deallocate((_Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>_>
                       *)__first,(pointer)((long)pTVar8[4]._vptr_TestInstance - (long)__first >> 5),
                      __n);
      pTVar8[3]._vptr_TestInstance = (_func_int **)__result;
      pTVar8[3].m_context = pCVar12;
      pTVar8[4]._vptr_TestInstance = (_func_int **)(__result + uVar16);
    }
    else {
      std::
      allocator_traits<std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>>
      ::
      construct<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase,vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance::FilterCase>
                ((allocator_type *)pCVar12,(FilterCase *)&gMax,__args);
      pTVar8[3].m_context =
           (Context *)
           &((pTVar8[3].m_context)->m_device).
            super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.
            field_0x8;
    }
    lVar15 = lVar15 + 0x18;
  } while( true );
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}